

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_tag.c
# Opt level: O1

ssize_t ber_fetch_tag(void *ptr,size_t size,ber_tlv_tag_t *tag_r)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  if (size != 0) {
    uVar4 = (uint)(*ptr >> 6);
    uVar2 = *ptr & 0x1f;
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0x1f) {
      *tag_r = uVar4 + uVar2 * 4;
      return 1;
    }
    if (size != 1) {
      uVar5 = 2;
      uVar2 = 0;
      while( true ) {
        bVar1 = *(byte *)((long)ptr + (uVar5 - 1));
        uVar6 = uVar2 << 7;
        if ((char)bVar1 < '\0') {
          uVar2 = bVar1 & 0x7f | uVar6;
          bVar7 = uVar6 < 0x800000;
          if (!bVar7) {
            uVar3 = 0xffffffffffffffff;
          }
        }
        else {
          uVar2 = uVar6 | bVar1;
          *tag_r = uVar4 + uVar2 * 4;
          bVar7 = false;
          uVar3 = uVar5;
        }
        if (!bVar7) break;
        uVar5 = uVar5 + 1;
        if (size < uVar5) {
          return 0;
        }
      }
      return uVar3;
    }
  }
  return 0;
}

Assistant:

ssize_t
ber_fetch_tag(const void *ptr, size_t size, ber_tlv_tag_t *tag_r) {
	ber_tlv_tag_t val;
	ber_tlv_tag_t tclass;
	size_t skipped;

	if(size == 0)
		return 0;

	val = *(const uint8_t *)ptr;
	tclass = (val >> 6);
	if((val &= 0x1F) != 0x1F) {
		/*
		 * Simple form: everything encoded in a single octet.
		 * Tag Class is encoded using two least significant bits.
		 */
		*tag_r = (val << 2) | tclass;
		return 1;
	}

	/*
	 * Each octet contains 7 bits of useful information.
	 * The MSB is 0 if it is the last octet of the tag.
	 */
	for(val = 0, ptr = ((const char *)ptr) + 1, skipped = 2;
			skipped <= size;
				ptr = ((const char *)ptr) + 1, skipped++) {
		unsigned int oct = *(const uint8_t *)ptr;
		if(oct & 0x80) {
			val = (val << 7) | (oct & 0x7F);
			/*
			 * Make sure there are at least 9 bits spare
			 * at the MS side of a value.
			 */
			if(val >> ((8 * sizeof(val)) - 9)) {
				/*
				 * We would not be able to accomodate
				 * any more tag bits.
				 */
				return -1;
			}
		} else {
			val = (val << 7) | oct;
			*tag_r = (val << 2) | tclass;
			return skipped;
		}
	}

	return 0;	/* Want more */
}